

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O3

void __thiscall
oqpi::local_sync_object<oqpi::posix_event<oqpi::event_auto_reset_policy_impl>_>::local_sync_object<>
          (local_sync_object<oqpi::posix_event<oqpi::event_auto_reset_policy_impl>_> *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  posix_semaphore_wrapper::posix_semaphore_wrapper
            ((posix_semaphore_wrapper *)this,&local_38,open_or_create,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

local_sync_object(_Args &&...args)
            : _Impl("", sync_object_creation_options::open_or_create, std::forward<_Args>(args)...)
        {}